

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

unique_ptr<Sock,_std::default_delete<Sock>_> ConnectDirectly(CService *dest,bool manual_connection)

{
  long lVar1;
  socklen_t len_00;
  undefined8 sock;
  bool bVar2;
  sa_family_t sVar3;
  Logger *this;
  bool in_DL;
  undefined7 in_register_00000031;
  CService *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  socklen_t len;
  undefined1 local_d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  sockaddr_storage sockaddr;
  
  this_00 = (CService *)CONCAT71(in_register_00000031,manual_connection);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = CService::GetSAFamily(this_00);
  std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::operator()
            ((function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)local_d8
             ,0x13b3770,(uint)sVar3,1);
  if ((Sock *)local_d8._0_8_ == (Sock *)0x0) {
    this = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(this,NET,Error);
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&sockaddr,this_00);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
      ;
      source_file._M_len = 0x5b;
      logging_function._M_str = "ConnectDirectly";
      logging_function._M_len = 0xf;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x275,NET,Error,(ConstevalFormatString<1U>)0x11166ef,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sockaddr);
      if ((char *)sockaddr._0_8_ != sockaddr.__ss_padding + 0xe) goto LAB_00d540e3;
    }
  }
  else {
    len = 0x80;
    bVar2 = CService::GetSockAddr(this_00,(sockaddr *)&sockaddr,&len);
    sock = local_d8._0_8_;
    len_00 = len;
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_((string *)(local_d8 + 8),this_00);
      bVar2 = ConnectToSocket((Sock *)sock,(sockaddr *)&sockaddr,len_00,(string *)(local_d8 + 8),
                              in_DL);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._8_8_ != &local_c0) {
        operator_delete((void *)local_d8._8_8_,(ulong)(local_c0._M_allocated_capacity + 1));
      }
      if (bVar2) {
        (dest->super_CNetAddr).m_addr._union.indirect_contents.indirect = (char *)local_d8._0_8_;
        local_d8._0_8_ = (Sock *)0x0;
        goto LAB_00d540f2;
      }
    }
    else {
      CService::ToStringAddrPort_abi_cxx11_((string *)(local_d8 + 8),this_00);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
      ;
      source_file_00._M_len = 0x5b;
      logging_function_00._M_str = "ConnectDirectly";
      logging_function_00._M_len = 0xf;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_00,source_file_00,0x27d,ALL,Info,
                 (ConstevalFormatString<1U>)0x111671c,(string *)(local_d8 + 8));
      sockaddr.__ss_padding._14_8_ = local_c0._M_allocated_capacity;
      sockaddr._0_8_ = local_d8._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._8_8_ != &local_c0) {
LAB_00d540e3:
        operator_delete((void *)sockaddr._0_8_,(ulong)(sockaddr.__ss_padding._14_8_ + 1));
      }
    }
  }
  (dest->super_CNetAddr).m_addr._union.indirect_contents.indirect = (char *)0x0;
LAB_00d540f2:
  if ((Sock *)local_d8._0_8_ != (Sock *)0x0) {
    (**(code **)(*(long *)local_d8._0_8_ + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
         (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)dest;
}

Assistant:

std::unique_ptr<Sock> ConnectDirectly(const CService& dest, bool manual_connection)
{
    auto sock = CreateSock(dest.GetSAFamily(), SOCK_STREAM, IPPROTO_TCP);
    if (!sock) {
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "Cannot create a socket for connecting to %s\n", dest.ToStringAddrPort());
        return {};
    }

    // Create a sockaddr from the specified service.
    struct sockaddr_storage sockaddr;
    socklen_t len = sizeof(sockaddr);
    if (!dest.GetSockAddr((struct sockaddr*)&sockaddr, &len)) {
        LogPrintf("Cannot get sockaddr for %s: unsupported network\n", dest.ToStringAddrPort());
        return {};
    }

    if (!ConnectToSocket(*sock, (struct sockaddr*)&sockaddr, len, dest.ToStringAddrPort(), manual_connection)) {
        return {};
    }

    return sock;
}